

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTRefCount.hpp
# Opt level: O0

void __thiscall antlr::ASTRefCount<antlr::BaseAST>::~ASTRefCount(ASTRefCount<antlr::BaseAST> *this)

{
  bool bVar1;
  long *in_RDI;
  ASTRef *this_00;
  
  if (((*in_RDI != 0) && (bVar1 = ASTRef::decrement((ASTRef *)*in_RDI), bVar1)) &&
     (this_00 = (ASTRef *)*in_RDI, this_00 != (ASTRef *)0x0)) {
    ASTRef::~ASTRef(this_00);
    operator_delete(this_00,0x10);
  }
  return;
}

Assistant:

~ASTRefCount()
	{
		if (ref && ref->decrement())
			delete ref;
	}